

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

int __thiscall
booster::aio::basic_socket::bind(basic_socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  error_code eVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  error_code e;
  system_error *in_stack_ffffffffffffffc0;
  error_code local_20;
  undefined8 local_10;
  basic_socket *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  std::error_code::error_code((error_code *)this);
  bind(this,(int)local_10,(sockaddr *)&local_20,__len);
  bVar2 = std::error_code::operator_cast_to_bool(&local_20);
  if (!bVar2) {
    return (int)CONCAT71(extraout_var,bVar2);
  }
  uVar3 = __cxa_allocate_exception(0x40);
  eVar1._M_cat = local_20._M_cat;
  eVar1._M_value = local_20._M_value;
  eVar1._4_4_ = local_20._4_4_;
  system::system_error::system_error(in_stack_ffffffffffffffc0,eVar1);
  __cxa_throw(uVar3,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void basic_socket::bind(endpoint const &ep)
{
	system::error_code e;
	bind(ep,e);
	if(e)
		throw system::system_error(e);
}